

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Eventregister.cpp
# Opt level: O3

bool __thiscall EventRegister::has(EventRegister *this,string *event)

{
  size_type sVar1;
  pointer pcVar2;
  int iVar3;
  iterator iVar4;
  size_type sVar5;
  
  sVar1 = event->_M_string_length;
  if (sVar1 != 0) {
    pcVar2 = (event->_M_dataplus)._M_p;
    sVar5 = 0;
    do {
      iVar3 = tolower((uint)(byte)pcVar2[sVar5]);
      pcVar2[sVar5] = (char)iVar3;
      sVar5 = sVar5 + 1;
    } while (sVar1 != sVar5);
  }
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Event,_std::default_delete<Event>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Event,_std::default_delete<Event>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Event,_std::default_delete<Event>_>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Event,_std::default_delete<Event>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Event,_std::default_delete<Event>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Event,_std::default_delete<Event>_>_>_>_>
                  *)this,event);
  return (_Rb_tree_header *)iVar4._M_node != &(this->m_events)._M_t._M_impl.super__Rb_tree_header;
}

Assistant:

bool EventRegister::has(std::string event)
{
    toLower(event);
    return m_events.find(event) != m_events.end();
}